

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiContext *g;
  float fVar5;
  
  pIVar3 = GImGui;
  if (((((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
          (GImGui->HoveredIdAllowOverlap == true)) &&
         (pIVar1 = GImGui->CurrentWindow, GImGui->HoveredWindow == pIVar1)) &&
        ((GImGui->ActiveId == id || GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap == true))
        )) && ((bVar4 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar4 &&
               (pIVar3->NavDisableMouseHover == false)))) &&
      ((((pIVar3->NavWindow == (ImGuiWindow *)0x0 ||
         (pIVar2 = pIVar3->NavWindow->RootWindow, pIVar2 == (ImGuiWindow *)0x0)) ||
        (pIVar2->WasActive != true)) ||
       ((pIVar2 == pIVar1->RootWindow || ((pIVar2->Flags & 0xc000000) == 0)))))) &&
     (((pIVar1->DC).ItemFlags & 4) == 0)) {
    pIVar3->HoveredId = id;
    pIVar3->HoveredIdAllowOverlap = false;
    fVar5 = 0.0;
    if ((id != 0) && (pIVar3->HoveredIdPreviousFrame == id)) {
      fVar5 = pIVar3->HoveredIdTimer + (pIVar3->IO).DeltaTime;
    }
    pIVar3->HoveredIdTimer = fVar5;
    return true;
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (g.NavDisableMouseHover || !IsWindowContentHoverable(window, ImGuiHoveredFlags_Default))
        return false;
    if (window->DC.ItemFlags & ImGuiItemFlags_Disabled)
        return false;

    SetHoveredID(id);
    return true;
}